

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavUpdateWindowing(void)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  bool bVar4;
  ImGuiInputSource IVar5;
  int focus_change_dir_00;
  bool bVar6;
  float fVar7;
  float fVar8;
  uint local_94;
  ImGuiWindow *local_78;
  bool local_69;
  ImGuiWindow *old_nav_window;
  ImGuiWindow *new_nav_window;
  float local_4c;
  undefined4 local_48;
  float move_speed;
  float NAV_MOVE_SPEED;
  ImVec2 local_3c;
  ImVec2 local_34;
  ImVec2 move_delta;
  int focus_change_dir;
  ImGuiWindow *window;
  bool start_windowing_with_keyboard;
  bool start_windowing_with_gamepad;
  ImGuiWindow *pIStack_18;
  bool apply_toggle_layer;
  ImGuiWindow *apply_focus_window;
  ImGuiContext *g;
  
  pIVar2 = GImGui;
  pIStack_18 = (ImGuiWindow *)0x0;
  bVar6 = false;
  local_69 = false;
  if (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0) {
    local_69 = IsNavInputPressed(3,ImGuiInputReadMode_Pressed);
  }
  bVar4 = false;
  if ((pIVar2->NavWindowingTarget == (ImGuiWindow *)0x0) &&
     (bVar4 = false, ((pIVar2->IO).KeyCtrl & 1U) != 0)) {
    bVar3 = IsKeyPressedMap(0,true);
    bVar4 = false;
    if (bVar3) {
      bVar4 = ((pIVar2->IO).ConfigFlags & 1U) != 0;
    }
  }
  if ((local_69 != false) || (bVar4)) {
    if (pIVar2->NavWindow == (ImGuiWindow *)0x0) {
      local_78 = FindWindowNavigable((pIVar2->Windows).Size + -1,-0x7fffffff,-1);
    }
    else {
      local_78 = pIVar2->NavWindow;
    }
    stack0xffffffffffffffd8 = local_78;
    if (local_78 != (ImGuiWindow *)0x0) {
      pIVar2->NavWindowingTarget = local_78->RootWindowForTabbing;
      pIVar2->NavWindowingHighlightAlpha = 0.0;
      pIVar2->NavWindowingHighlightTimer = 0.0;
      pIVar2->NavWindowingToggleLayer = (bool)(bVar4 + '\x01');
      IVar5 = ImGuiInputSource_NavGamepad;
      if (bVar4) {
        IVar5 = ImGuiInputSource_NavKeyboard;
      }
      pIVar2->NavInputSource = IVar5;
    }
  }
  pIVar2->NavWindowingHighlightTimer = (pIVar2->IO).DeltaTime + pIVar2->NavWindowingHighlightTimer;
  if ((pIVar2->NavWindowingTarget != (ImGuiWindow *)0x0) &&
     (pIVar2->NavInputSource == ImGuiInputSource_NavGamepad)) {
    fVar8 = pIVar2->NavWindowingHighlightAlpha;
    fVar7 = ImSaturate((pIVar2->NavWindowingHighlightTimer - 0.2) / 0.05);
    fVar8 = ImMax<float>(fVar8,fVar7);
    pIVar2->NavWindowingHighlightAlpha = fVar8;
    bVar4 = IsNavInputPressed(0xc,ImGuiInputReadMode_RepeatSlow);
    bVar3 = IsNavInputPressed(0xd,ImGuiInputReadMode_RepeatSlow);
    move_delta.x = (float)((uint)bVar4 - (uint)bVar3);
    if (move_delta.x != 0.0) {
      NavUpdateWindowingHighlightWindow((int)move_delta.x);
      pIVar2->NavWindowingHighlightAlpha = 1.0;
    }
    bVar4 = IsNavInputDown(3);
    if (!bVar4) {
      pIVar2->NavWindowingToggleLayer =
           (pIVar2->NavWindowingToggleLayer & 1U &
           (pIVar2->NavWindowingHighlightAlpha <= 1.0 && pIVar2->NavWindowingHighlightAlpha != 1.0))
           != 0;
      if (((pIVar2->NavWindowingToggleLayer & 1U) == 0) || (pIVar2->NavWindow == (ImGuiWindow *)0x0)
         ) {
        if ((pIVar2->NavWindowingToggleLayer & 1U) == 0) {
          pIStack_18 = pIVar2->NavWindowingTarget;
        }
      }
      else {
        bVar6 = true;
      }
      pIVar2->NavWindowingTarget = (ImGuiWindow *)0x0;
    }
  }
  if ((pIVar2->NavWindowingTarget != (ImGuiWindow *)0x0) &&
     (pIVar2->NavInputSource == ImGuiInputSource_NavKeyboard)) {
    fVar8 = pIVar2->NavWindowingHighlightAlpha;
    fVar7 = ImSaturate((pIVar2->NavWindowingHighlightTimer - 0.15) / 0.04);
    fVar8 = ImMax<float>(fVar8,fVar7);
    pIVar2->NavWindowingHighlightAlpha = fVar8;
    bVar4 = IsKeyPressedMap(0,true);
    if (bVar4) {
      focus_change_dir_00 = -1;
      if (((pIVar2->IO).KeyShift & 1U) != 0) {
        focus_change_dir_00 = 1;
      }
      NavUpdateWindowingHighlightWindow(focus_change_dir_00);
    }
    if (((pIVar2->IO).KeyCtrl & 1U) == 0) {
      pIStack_18 = pIVar2->NavWindowingTarget;
    }
  }
  if (((pIVar2->ActiveId == 0) || ((pIVar2->ActiveIdAllowOverlap & 1U) != 0)) &&
     (bVar4 = IsNavInputPressed(0x10,ImGuiInputReadMode_Released), bVar4)) {
    bVar4 = IsMousePosValid(&(pIVar2->IO).MousePos);
    bVar3 = IsMousePosValid(&(pIVar2->IO).MousePosPrev);
    if (bVar4 == bVar3) {
      bVar6 = true;
    }
  }
  if ((pIVar2->NavWindowingTarget != (ImGuiWindow *)0x0) &&
     ((pIVar2->NavWindowingTarget->Flags & 4U) == 0)) {
    ImVec2::ImVec2(&local_34);
    if ((pIVar2->NavInputSource == ImGuiInputSource_NavKeyboard) &&
       (((pIVar2->IO).KeyShift & 1U) == 0)) {
      local_3c = GetNavInputAmount2d(1,ImGuiInputReadMode_Down,0.0,0.0);
      local_34 = local_3c;
    }
    if (pIVar2->NavInputSource == ImGuiInputSource_NavGamepad) {
      _move_speed = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.0,0.0);
      local_34 = _move_speed;
    }
    if ((local_34.x == 0.0) && (!NAN(local_34.x))) {
      if ((local_34.y == 0.0) && (!NAN(local_34.y))) goto LAB_001e9dd6;
    }
    local_48 = 0x44480000;
    fVar8 = (pIVar2->IO).DeltaTime;
    fVar7 = ImMin<float>((pIVar2->IO).DisplayFramebufferScale.x,
                         (pIVar2->IO).DisplayFramebufferScale.y);
    local_4c = ImFloor(fVar8 * 800.0 * fVar7);
    register0x00001200 = ::operator*(&local_34,local_4c);
    operator+=(&pIVar2->NavWindowingTarget->Pos,(ImVec2 *)((long)&new_nav_window + 4));
    pIVar2->NavDisableMouseHover = true;
    MarkIniSettingsDirty(pIVar2->NavWindowingTarget);
  }
LAB_001e9dd6:
  if ((pIStack_18 != (ImGuiWindow *)0x0) &&
     ((pIVar2->NavWindow == (ImGuiWindow *)0x0 ||
      (pIStack_18 != pIVar2->NavWindow->RootWindowForTabbing)))) {
    pIVar2->NavDisableHighlight = false;
    pIVar2->NavDisableMouseHover = true;
    pIStack_18 = NavRestoreLastChildNavWindow(pIStack_18);
    ClosePopupsOverWindow(pIStack_18);
    FocusWindow(pIStack_18);
    if (pIStack_18->NavLastIds[0] == 0) {
      NavInitWindow(pIStack_18,false);
    }
    if ((pIStack_18->DC).NavLayerActiveMask == 2) {
      pIVar2->NavLayer = 1;
    }
  }
  if (pIStack_18 != (ImGuiWindow *)0x0) {
    pIVar2->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((bVar6) && (pIVar2->NavWindow != (ImGuiWindow *)0x0)) {
    old_nav_window = pIVar2->NavWindow;
    while( true ) {
      bVar6 = false;
      if ((((old_nav_window->DC).NavLayerActiveMask & 2U) == 0) &&
         (bVar6 = false, (old_nav_window->Flags & 0x1000000U) != 0)) {
        bVar6 = (old_nav_window->Flags & 0x14000000U) == 0;
      }
      if (!bVar6) break;
      old_nav_window = old_nav_window->ParentWindow;
    }
    if (old_nav_window != pIVar2->NavWindow) {
      pIVar1 = pIVar2->NavWindow;
      FocusWindow(old_nav_window);
      old_nav_window->NavLastChildNavWindow = pIVar1;
    }
    pIVar2->NavDisableHighlight = false;
    pIVar2->NavDisableMouseHover = true;
    if (((pIVar2->NavWindow->DC).NavLayerActiveMask & 2U) == 0) {
      local_94 = 0;
    }
    else {
      local_94 = pIVar2->NavLayer ^ 1;
    }
    NavRestoreLayer(local_94);
  }
  return;
}

Assistant:

static void ImGui::NavUpdateWindowing()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* apply_focus_window = NULL;
    bool apply_toggle_layer = false;

    bool start_windowing_with_gamepad = !g.NavWindowingTarget && IsNavInputPressed(ImGuiNavInput_Menu, ImGuiInputReadMode_Pressed);
    bool start_windowing_with_keyboard = !g.NavWindowingTarget && g.IO.KeyCtrl && IsKeyPressedMap(ImGuiKey_Tab) && (g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard);
    if (start_windowing_with_gamepad || start_windowing_with_keyboard)
        if (ImGuiWindow* window = g.NavWindow ? g.NavWindow : FindWindowNavigable(g.Windows.Size - 1, -INT_MAX, -1))
        {
            g.NavWindowingTarget = window->RootWindowForTabbing;
            g.NavWindowingHighlightTimer = g.NavWindowingHighlightAlpha = 0.0f;
            g.NavWindowingToggleLayer = start_windowing_with_keyboard ? false : true;
            g.NavInputSource = start_windowing_with_keyboard ? ImGuiInputSource_NavKeyboard : ImGuiInputSource_NavGamepad;
        }

    // Gamepad update
    g.NavWindowingHighlightTimer += g.IO.DeltaTime;
    if (g.NavWindowingTarget && g.NavInputSource == ImGuiInputSource_NavGamepad)
    {
        // Highlight only appears after a brief time holding the button, so that a fast tap on PadMenu (to toggle NavLayer) doesn't add visual noise
        g.NavWindowingHighlightAlpha = ImMax(g.NavWindowingHighlightAlpha, ImSaturate((g.NavWindowingHighlightTimer - 0.20f) / 0.05f));

        // Select window to focus
        const int focus_change_dir = (int)IsNavInputPressed(ImGuiNavInput_FocusPrev, ImGuiInputReadMode_RepeatSlow) - (int)IsNavInputPressed(ImGuiNavInput_FocusNext, ImGuiInputReadMode_RepeatSlow);
        if (focus_change_dir != 0)
        {
            NavUpdateWindowingHighlightWindow(focus_change_dir);
            g.NavWindowingHighlightAlpha = 1.0f;
        }

        // Single press toggles NavLayer, long press with L/R apply actual focus on release (until then the window was merely rendered front-most)
        if (!IsNavInputDown(ImGuiNavInput_Menu))
        {
            g.NavWindowingToggleLayer &= (g.NavWindowingHighlightAlpha < 1.0f); // Once button was held long enough we don't consider it a tap-to-toggle-layer press anymore.
            if (g.NavWindowingToggleLayer && g.NavWindow)
                apply_toggle_layer = true;
            else if (!g.NavWindowingToggleLayer)
                apply_focus_window = g.NavWindowingTarget;
            g.NavWindowingTarget = NULL;
        }
    }

    // Keyboard: Focus
    if (g.NavWindowingTarget && g.NavInputSource == ImGuiInputSource_NavKeyboard)
    {
        // Visuals only appears after a brief time after pressing TAB the first time, so that a fast CTRL+TAB doesn't add visual noise
        g.NavWindowingHighlightAlpha = ImMax(g.NavWindowingHighlightAlpha, ImSaturate((g.NavWindowingHighlightTimer - 0.15f) / 0.04f)); // 1.0f
        if (IsKeyPressedMap(ImGuiKey_Tab, true))
            NavUpdateWindowingHighlightWindow(g.IO.KeyShift ? +1 : -1);
        if (!g.IO.KeyCtrl)
            apply_focus_window = g.NavWindowingTarget;
    }

    // Keyboard: Press and Release ALT to toggle menu layer
    // FIXME: We lack an explicit IO variable for "is the imgui window focused", so compare mouse validity to detect the common case of back-end clearing releases all keys on ALT-TAB
    if ((g.ActiveId == 0 || g.ActiveIdAllowOverlap) && IsNavInputPressed(ImGuiNavInput_KeyMenu_, ImGuiInputReadMode_Released))
        if (IsMousePosValid(&g.IO.MousePos) == IsMousePosValid(&g.IO.MousePosPrev))
            apply_toggle_layer = true;

    // Move window
    if (g.NavWindowingTarget && !(g.NavWindowingTarget->Flags & ImGuiWindowFlags_NoMove))
    {
        ImVec2 move_delta;
        if (g.NavInputSource == ImGuiInputSource_NavKeyboard && !g.IO.KeyShift)
            move_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard, ImGuiInputReadMode_Down);
        if (g.NavInputSource == ImGuiInputSource_NavGamepad)
            move_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_PadLStick, ImGuiInputReadMode_Down);
        if (move_delta.x != 0.0f || move_delta.y != 0.0f)
        {
            const float NAV_MOVE_SPEED = 800.0f;
            const float move_speed = ImFloor(NAV_MOVE_SPEED * g.IO.DeltaTime * ImMin(g.IO.DisplayFramebufferScale.x, g.IO.DisplayFramebufferScale.y)); // FIXME: Doesn't code variable framerate very well
            g.NavWindowingTarget->Pos += move_delta * move_speed;
            g.NavDisableMouseHover = true;
            MarkIniSettingsDirty(g.NavWindowingTarget);
        }
    }

    // Apply final focus
    if (apply_focus_window && (g.NavWindow == NULL || apply_focus_window != g.NavWindow->RootWindowForTabbing))
    {
        g.NavDisableHighlight = false;
        g.NavDisableMouseHover = true;
        apply_focus_window = NavRestoreLastChildNavWindow(apply_focus_window);
        ClosePopupsOverWindow(apply_focus_window);
        FocusWindow(apply_focus_window);
        if (apply_focus_window->NavLastIds[0] == 0)
            NavInitWindow(apply_focus_window, false);

        // If the window only has a menu layer, select it directly
        if (apply_focus_window->DC.NavLayerActiveMask == (1 << 1))
            g.NavLayer = 1;
    }
    if (apply_focus_window)
        g.NavWindowingTarget = NULL;

    // Apply menu/layer toggle
    if (apply_toggle_layer && g.NavWindow)
    {
        ImGuiWindow* new_nav_window = g.NavWindow;
        while ((new_nav_window->DC.NavLayerActiveMask & (1 << 1)) == 0 && (new_nav_window->Flags & ImGuiWindowFlags_ChildWindow) != 0 && (new_nav_window->Flags & (ImGuiWindowFlags_Popup | ImGuiWindowFlags_ChildMenu)) == 0)
            new_nav_window = new_nav_window->ParentWindow;
        if (new_nav_window != g.NavWindow)
        {
            ImGuiWindow* old_nav_window = g.NavWindow;
            FocusWindow(new_nav_window);
            new_nav_window->NavLastChildNavWindow = old_nav_window;
        }
        g.NavDisableHighlight = false;
        g.NavDisableMouseHover = true;
        NavRestoreLayer((g.NavWindow->DC.NavLayerActiveMask & (1 << 1)) ? (g.NavLayer ^ 1) : 0);
    }
}